

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::SocketWriter::Send(SocketWriter *this,string *message)

{
  size_t __n;
  size_t sVar1;
  ostream *poVar2;
  GTestLog local_20;
  GTestLog local_1c;
  
  if (this->sockfd_ == -1) {
    GTestLog::GTestLog(&local_20,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x439);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition sockfd_ != -1 failed. ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Send() can be called only when there is a connection.",0x35);
    GTestLog::~GTestLog(&local_20);
  }
  __n = message->_M_string_length;
  sVar1 = write(this->sockfd_,(message->_M_dataplus)._M_p,__n);
  if (sVar1 != __n) {
    GTestLog::GTestLog(&local_1c,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x43e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"stream_result_to: failed to stream to ",0x26);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->host_name_)._M_dataplus._M_p,
                        (this->host_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(this->port_num_)._M_dataplus._M_p,(this->port_num_)._M_string_length);
    GTestLog::~GTestLog(&local_1c);
  }
  return;
}

Assistant:

void Send(const std::string& message) override {
      GTEST_CHECK_(sockfd_ != -1)
          << "Send() can be called only when there is a connection.";

      const auto len = static_cast<size_t>(message.length());
      if (write(sockfd_, message.c_str(), len) != static_cast<ssize_t>(len)) {
        GTEST_LOG_(WARNING)
            << "stream_result_to: failed to stream to "
            << host_name_ << ":" << port_num_;
      }
    }